

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O2

void __thiscall FIX::SessionID::SessionID(SessionID *this)

{
  BeginString::BeginString(&this->m_beginString);
  SenderCompID::SenderCompID(&this->m_senderCompID);
  TargetCompID::TargetCompID(&this->m_targetCompID);
  (this->m_sessionQualifier)._M_dataplus._M_p = (pointer)&(this->m_sessionQualifier).field_2;
  (this->m_sessionQualifier)._M_string_length = 0;
  (this->m_sessionQualifier).field_2._M_local_buf[0] = '\0';
  (this->m_frozenString)._M_dataplus._M_p = (pointer)&(this->m_frozenString).field_2;
  (this->m_frozenString)._M_string_length = 0;
  (this->m_frozenString).field_2._M_local_buf[0] = '\0';
  toString(this,&this->m_frozenString);
  return;
}

Assistant:

SessionID() { toString(m_frozenString); }